

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

QFunctionsDiscrete * __thiscall
AlphaVectorPlanning::Prune
          (QFunctionsDiscrete *__return_storage_ptr__,AlphaVectorPlanning *this,
          QFunctionsDiscrete *Q)

{
  long lVar1;
  pointer pvVar2;
  ulong uVar3;
  ulong uVar4;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_68;
  ValueFunctionPOMDPDiscrete local_48;
  
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&local_68);
  pvVar2 = (Q->
           super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((Q->
      super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      Prune(&local_48,this,pvVar2 + uVar3);
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start =
           pvVar2[uVar3].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&pvVar2[uVar3].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                    _M_impl.super__Vector_impl_data + 8);
      local_68.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&pvVar2[uVar3].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                    _M_impl.super__Vector_impl_data + 0x10);
      pvVar2[uVar3].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&pvVar2[uVar3].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data + 8) =
           local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&pvVar2[uVar3].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data + 0x10) =
           local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_68);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_48);
      pvVar2 = (Q->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar1 = ((long)(Q->
                     super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555 - uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (lVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete AlphaVectorPlanning::Prune(const QFunctionsDiscrete &Q) const
{
    QFunctionsDiscrete Q1(Q.size());
    size_t nrAlphas=0;

#if 0
    cout << "Calling Cassandra's pomdp-tools for pruning a Q-value function of size <";
    for(Index a=0;a!=Q.size();++a)
        cout << " " << Q[a].size();
    cout << " >" << endl;
#endif

    for(Index a=0;a!=Q.size();++a)
    {

#if DEBUG_AlphaVectorPlanning_Prune
//        cout << "AlphaVectorPlanning::Prune for action " << a << ": " << Q.size() << " vectors" << endl;
#endif
        Q1[a]=Prune(Q[a]);
        nrAlphas+=Q1[a].size();
        
    }

#if DEBUG_AlphaVectorPlanning_Prune
        cout << "AlphaVectorPlanning::Prune for action " << a << ": reduced "
             << Q[a].size() << " to " 
             << Q1[a].size()
             << " (total #vectors: " << nrAlphas << ")" << endl;
#endif

    return(Q1);
}